

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

TCase * tcase_create(char *name)

{
  TCase *pTVar1;
  List *pLVar2;
  double dVar3;
  double tmp_1;
  char *endptr_1;
  double tmp;
  char *endptr;
  TCase *tc;
  double timeout_sec;
  char *env;
  char *name_local;
  
  tc = (TCase *)0x4010000000000000;
  env = name;
  endptr = (char *)emalloc(0x48);
  if (env == (char *)0x0) {
    *(char **)endptr = "";
  }
  else {
    *(char **)endptr = env;
  }
  timeout_sec = (double)getenv("CK_DEFAULT_TIMEOUT");
  if ((char *)timeout_sec != (char *)0x0) {
    tmp = 0.0;
    endptr_1 = (char *)strtod((char *)timeout_sec,(char **)&tmp);
    if (((0.0 <= (double)endptr_1) && (tmp != timeout_sec)) && (*(char *)tmp == '\0')) {
      tc = (TCase *)endptr_1;
    }
  }
  timeout_sec = (double)getenv("CK_TIMEOUT_MULTIPLIER");
  if ((char *)timeout_sec != (char *)0x0) {
    tmp_1 = 0.0;
    dVar3 = strtod((char *)timeout_sec,(char **)&tmp_1);
    if (((0.0 <= dVar3) && (tmp_1 != timeout_sec)) && (*(char *)tmp_1 == '\0')) {
      tc = (TCase *)((double)tc * dVar3);
    }
  }
  dVar3 = floor((double)tc);
  pTVar1 = tc;
  *(long *)(endptr + 8) = (long)dVar3;
  dVar3 = floor((double)tc);
  *(long *)(endptr + 0x10) = (long)(((double)pTVar1 - dVar3) * 1000000000.0);
  pLVar2 = check_list_create();
  *(List **)(endptr + 0x18) = pLVar2;
  pLVar2 = check_list_create();
  *(List **)(endptr + 0x20) = pLVar2;
  pLVar2 = check_list_create();
  *(List **)(endptr + 0x30) = pLVar2;
  pLVar2 = check_list_create();
  *(List **)(endptr + 0x28) = pLVar2;
  pLVar2 = check_list_create();
  *(List **)(endptr + 0x38) = pLVar2;
  pLVar2 = check_list_create();
  *(List **)(endptr + 0x40) = pLVar2;
  return (TCase *)endptr;
}

Assistant:

TCase *tcase_create(const char *name)
{
    char *env;
    double timeout_sec = DEFAULT_TIMEOUT;

    TCase *tc = (TCase *)emalloc(sizeof(TCase)); /*freed in tcase_free */

    if(name == NULL)
        tc->name = "";
    else
        tc->name = name;

    env = getenv("CK_DEFAULT_TIMEOUT");
    if(env != NULL)
    {
        char *endptr = NULL;
        double tmp = strtod(env, &endptr);

        if(tmp >= 0 && endptr != env && (*endptr) == '\0')
        {
            timeout_sec = tmp;
        }
    }

    env = getenv("CK_TIMEOUT_MULTIPLIER");
    if(env != NULL)
    {
        char *endptr = NULL;
        double tmp = strtod(env, &endptr);

        if(tmp >= 0 && endptr != env && (*endptr) == '\0')
        {
            timeout_sec = timeout_sec * tmp;
        }
    }

    tc->timeout.tv_sec = (time_t) floor(timeout_sec);
    tc->timeout.tv_nsec =
        (long)((timeout_sec -
                floor(timeout_sec)) * (double)NANOS_PER_SECONDS);

    tc->tflst = check_list_create();
    tc->unch_sflst = check_list_create();
    tc->ch_sflst = check_list_create();
    tc->unch_tflst = check_list_create();
    tc->ch_tflst = check_list_create();
    tc->tags = check_list_create();

    return tc;
}